

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::OffsetNodeMeshIndices(aiNode *node,uint offset)

{
  ulong uVar1;
  
  if (node->mNumMeshes != 0) {
    uVar1 = 0;
    do {
      node->mMeshes[uVar1] = node->mMeshes[uVar1] + offset;
      uVar1 = uVar1 + 1;
    } while (uVar1 < node->mNumMeshes);
  }
  if (node->mNumChildren != 0) {
    uVar1 = 0;
    do {
      OffsetNodeMeshIndices(node->mChildren[uVar1],offset);
      uVar1 = uVar1 + 1;
    } while (uVar1 < node->mNumChildren);
  }
  return;
}

Assistant:

void SceneCombiner::OffsetNodeMeshIndices (aiNode* node, unsigned int offset) {
    for (unsigned int i = 0; i < node->mNumMeshes;++i)
        node->mMeshes[i] += offset;

    for ( unsigned int i = 0; i < node->mNumChildren; ++i ) {
        OffsetNodeMeshIndices( node->mChildren[ i ], offset );
    }
}